

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestLong_Test::~PriceFieldTest_TestLong_Test
          (PriceFieldTest_TestLong_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PriceFieldTest, TestLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    EXPECT_EQ(PriceField::LONG, field.GetType());
    EXPECT_EQ(value, field.GetLong());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
    EXPECT_THROW(field.GetString(), std::logic_error);
}